

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O1

bool __thiscall
burst::
intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<void>_>
::equal(intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<void>_>
        *this,intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<void>_>
              *that)

{
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *piVar1;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *piVar2;
  char **ppcVar3;
  int iVar4;
  char *pcVar5;
  size_t __n;
  char *__s2;
  char *__s1;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *piVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var7;
  bool bVar8;
  
  piVar1 = (this->m_begin)._M_current;
  piVar6 = (that->m_begin)._M_current;
  if (piVar1 != piVar6) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/intersect_iterator.hpp"
                  ,0xea,
                  "bool burst::intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>>>>::equal(const intersect_iterator<RandomAccessIterator, Compare> &) const [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>>>, Compare = std::less<void>]"
                 );
  }
  piVar2 = (this->m_end)._M_current;
  if ((long)piVar2 - (long)piVar1 == (long)(that->m_end)._M_current - (long)piVar6) {
    bVar8 = piVar1 == piVar2;
    if (!bVar8) {
      __s1 = (piVar1->
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
             ).
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin._M_current;
      pcVar5 = (piVar1->
               super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
               ).
               super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_End._M_current;
      __s2 = (piVar6->
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
             ).
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin._M_current;
      __n = (long)pcVar5 - (long)__s1;
      if (__n == (long)(piVar6->
                       super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                       ).
                       super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                       .
                       super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                       .m_End._M_current - (long)__s2) {
        p_Var7 = &piVar6[1].
                  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                  .
                  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                  .
                  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                  .m_End;
        do {
          piVar6 = piVar1 + 1;
          if ((pcVar5 != __s1) && (iVar4 = bcmp(__s1,__s2,__n), iVar4 != 0)) {
            return bVar8;
          }
          bVar8 = piVar6 == piVar2;
          if (bVar8) {
            return bVar8;
          }
          __s1 = (piVar6->
                 super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                 ).
                 super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                 .m_Begin._M_current;
          pcVar5 = piVar1[1].
                   super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                   .
                   super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                   .m_End._M_current;
          __s2 = (((iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                    *)(p_Var7 + -1))->m_Begin)._M_current;
          ppcVar3 = &p_Var7->_M_current;
          __n = (long)pcVar5 - (long)__s1;
          p_Var7 = p_Var7 + 2;
          piVar1 = piVar6;
        } while (__n == (long)*ppcVar3 - (long)__s2);
      }
    }
    return bVar8;
  }
  return false;
}

Assistant:

bool equal (const intersect_iterator & that) const
        {
            assert(this->m_begin == that.m_begin);
            return std::equal(this->m_begin, this->m_end, that.m_begin, that.m_end);
        }